

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O2

void __thiscall
cxxopts::OptionDetails::OptionDetails
          (OptionDetails *this,string *short_,string *long_,String *desc,
          shared_ptr<const_cxxopts::Value> *val)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  size_t sVar3;
  hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_49;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  std::__cxx11::string::string((string *)this,(string *)short_);
  std::__cxx11::string::string((string *)&this->m_long,(string *)long_);
  std::__cxx11::string::string((string *)&this->m_desc,(string *)desc);
  (this->m_value).super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar1 = (val->super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var2 = (val->super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  (val->super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_value).super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar1;
  (this->m_value).super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var2;
  (val->super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  this->m_count = 0;
  this->m_hash = 0;
  std::operator+(&local_48,&this->m_long,&this->m_short);
  sVar3 = std::
          hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          operator()(&local_49,&local_48);
  this->m_hash = sVar3;
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

OptionDetails
    (
      std::string short_,
      std::string long_,
      String desc,
      std::shared_ptr<const Value> val
    )
    : m_short(std::move(short_))
    , m_long(std::move(long_))
    , m_desc(std::move(desc))
    , m_value(std::move(val))
    , m_count(0)
    {
      m_hash = std::hash<std::string>{}(m_long + m_short);
    }